

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drandmea.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long in_RSI;
  int in_EDI;
  double dVar2;
  int j;
  int i;
  NaReal fAmpl;
  int nMaxHalfPer;
  int nMinHalfPer;
  int nHalfPeriod;
  int nLength;
  double fMaxAmpl;
  double fMinAmpl;
  int local_40;
  int local_3c;
  undefined8 local_38;
  int local_30;
  int local_2c;
  int local_28;
  double local_20;
  double local_18;
  int local_4;
  
  if ((in_EDI == 5) || (in_EDI == 6)) {
    iVar1 = atoi(*(char **)(in_RSI + 8));
    if (iVar1 < 1) {
      fprintf(_stderr,"Length must be positive\n");
      local_4 = 2;
    }
    else {
      if (in_EDI == 5) {
        local_28 = atoi(*(char **)(in_RSI + 0x10));
        if (local_28 < 1) {
          fprintf(_stderr,"HalfPeriod must be positive\n");
          return 2;
        }
        local_18 = atof(*(char **)(in_RSI + 0x18));
        local_20 = atof(*(char **)(in_RSI + 0x20));
      }
      else {
        local_2c = atoi(*(char **)(in_RSI + 0x10));
        local_30 = atoi(*(char **)(in_RSI + 0x18));
        if ((local_2c < 1) || (local_30 < 1)) {
          fprintf(_stderr,"MinHalfPer and nMaxHalfPer must be positive\n");
          return 2;
        }
        local_18 = atof(*(char **)(in_RSI + 0x20));
        local_20 = atof(*(char **)(in_RSI + 0x28));
      }
      reset_rand();
      local_38 = rand_unified(local_18,local_20);
      if (in_EDI == 6) {
        dVar2 = (double)rand_unified((double)local_2c,(double)(local_30 + 1));
        local_28 = (int)dVar2;
        if (local_28 < 1) {
          local_28 = 1;
        }
      }
      local_3c = 0;
      local_40 = 0;
      while (local_3c < iVar1) {
        if (local_40 < local_28) {
          printf("%g\n",local_38);
          local_40 = local_40 + 1;
          local_3c = local_3c + 1;
        }
        else {
          local_38 = rand_unified(local_18,local_20);
          if (in_EDI == 6) {
            dVar2 = (double)rand_unified((double)local_2c,(double)(local_30 + 1));
            local_28 = (int)dVar2;
            if (local_28 < 1) {
              local_28 = 1;
            }
          }
          local_40 = 0;
        }
      }
      local_4 = 0;
    }
  }
  else {
    fprintf(_stderr,
            "Usage: drandmea Length HalfPeriod MinAmpl MaxAmpl\n   or  drandmea Length MinHalfPer MaxHalfPer MinAmpl MaxAmpl\nDRAND_SAFE=something to avoid the same seed in srand()\n"
           );
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc != 5 && argc != 6)
    {
      fprintf(stderr,
	      "Usage: drandmea Length HalfPeriod MinAmpl MaxAmpl\n"\
	      "   or  drandmea Length MinHalfPer MaxHalfPer MinAmpl MaxAmpl\n"\
	      "DRAND_SAFE=something to avoid the same seed in srand()\n");
      return 1;
    }

  double	fMinAmpl, fMaxAmpl;
  int		nLength, nHalfPeriod, nMinHalfPer, nMaxHalfPer;

  nLength = atoi(argv[1]);
  if(nLength <= 0)
    {
      fprintf(stderr, "Length must be positive\n");
      return 2;
    }

  if(argc == 5)
    {
      nHalfPeriod = atoi(argv[2]);
      if(nHalfPeriod <= 0)
	{
	  fprintf(stderr, "HalfPeriod must be positive\n");
	  return 2;
	}
      fMinAmpl = atof(argv[3]);
      fMaxAmpl = atof(argv[4]);
    }
  else
    {
      nMinHalfPer = atoi(argv[2]);
      nMaxHalfPer = atoi(argv[3]);
      if(nMinHalfPer <= 0 || nMaxHalfPer <= 0)
	{
	  fprintf(stderr, "MinHalfPer and nMaxHalfPer must be positive\n");
	  return 2;
	}
      fMinAmpl = atof(argv[4]);
      fMaxAmpl = atof(argv[5]);
    }

  // See DRAND_SAFE to prevent dependent random series
  reset_rand();

  NaReal	fAmpl = rand_unified(fMinAmpl, fMaxAmpl);
  if(argc == 6)
    {
      nHalfPeriod = rand_unified(nMinHalfPer, nMaxHalfPer + 1);
      if(nHalfPeriod <= 0)
	nHalfPeriod = 1;
    }

  int		i = 0, j = 0;
  while(i < nLength)
    {
      if(j < nHalfPeriod)
	{
	  printf("%g\n", fAmpl);
	  ++j;
	}
      else
	{
	  fAmpl = rand_unified(fMinAmpl, fMaxAmpl);
	  if(argc == 6)
	    {
	      nHalfPeriod = rand_unified(nMinHalfPer, nMaxHalfPer + 1);
	      if(nHalfPeriod <= 0)
		nHalfPeriod = 1;
	    }
	  j = 0;
	  continue;
	}
      ++i;
    }

  return 0;
}